

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrix.cpp
# Opt level: O0

BitMatrix *
ZXing::Deflate(BitMatrix *input,int width,int height,float top,float left,float subSampling)

{
  PointF p;
  bool bVar1;
  int iVar2;
  int iVar3;
  BitMatrix *in_RSI;
  BitMatrix *in_RDI;
  float in_XMM0_Da;
  float fVar4;
  float in_XMM1_Da;
  float in_XMM2_Da;
  int x;
  float yOffset;
  int y;
  BitMatrix *result;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  BitMatrix *this;
  int iVar5;
  PointT<double> local_58;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int iVar6;
  int iVar7;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_2c;
  
  BitMatrix::BitMatrix
            ((BitMatrix *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  local_2c = 0;
  while (iVar5 = local_2c, iVar2 = BitMatrix::height(in_RDI), iVar5 < iVar2) {
    fVar4 = (float)local_2c * in_XMM2_Da + in_XMM0_Da;
    iVar6 = 0;
    while (iVar7 = iVar6, iVar3 = BitMatrix::width(in_RDI), iVar6 < iVar3) {
      this = in_RSI;
      PointT<double>::PointT
                (&local_58,(double)((float)iVar7 * in_XMM2_Da + in_XMM1_Da),(double)fVar4);
      p.x._4_4_ = iVar3;
      p.x._0_4_ = iVar6;
      p.y._0_4_ = iVar5;
      p.y._4_4_ = iVar2;
      bVar1 = BitMatrix::get(this,p);
      in_stack_ffffffffffffff7c = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff7c);
      if (bVar1) {
        BitMatrix::set(this,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,false);
      }
      iVar6 = iVar7 + 1;
    }
    local_2c = local_2c + 1;
  }
  return in_RDI;
}

Assistant:

BitMatrix Deflate(const BitMatrix& input, int width, int height, float top, float left, float subSampling)
{
	BitMatrix result(width, height);

	for (int y = 0; y < result.height(); y++) {
		auto yOffset = top + y * subSampling;
		for (int x = 0; x < result.width(); x++) {
			if (input.get(PointF(left + x * subSampling, yOffset)))
				result.set(x, y);
		}
	}

	return result;
}